

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O2

void RunArrayToElements(ExpressionContext *ctx,VmModule *module,VmValue *value)

{
  SmallArray<VmValue_*,_4U> *this;
  VmValue *pVVar1;
  VmInstruction *pVVar2;
  VmValue *pVVar3;
  TypeBase *type;
  VmValue *value_00;
  VmInstruction *instruction;
  VmValue **ppVVar4;
  VmValue *pVVar5;
  VmConstant *src;
  TypeBase *type_00;
  VmBlock *block;
  InplaceStr *pIVar6;
  VmValue *value_01;
  uint i;
  VmValueType index;
  VmBlock **ppVVar7;
  uint in_stack_ffffffffffffff78;
  
  if (value != (VmValue *)0x0) {
    if (value->typeID == 3) {
      ppVVar7 = &module->currentBlock;
      module->currentBlock = (VmBlock *)value;
      pVVar2 = (VmInstruction *)value[1].comment.end;
      while (instruction = pVVar2, instruction != (VmInstruction *)0x0) {
        pVVar2 = instruction->nextSibling;
        if (instruction->cmd == VM_INST_STORE_STRUCT) {
          this = &instruction->arguments;
          ppVVar4 = SmallArray<VmValue_*,_4U>::operator[](this,0);
          pVVar1 = *ppVVar4;
          ppVVar4 = SmallArray<VmValue_*,_4U>::operator[](this,1);
          pVVar5 = *ppVVar4;
          if ((pVVar5 == (VmValue *)0x0) || (pVVar5->typeID != 1)) {
            pVVar5 = (VmValue *)0x0;
          }
          ppVVar4 = SmallArray<VmValue_*,_4U>::operator[](this,2);
          pVVar3 = *ppVVar4;
          if ((((pVVar3 != (VmValue *)0x0) && (pVVar3->typeID == 2)) &&
              (*(int *)&pVVar3[1]._vptr_VmValue == 0x4a)) && ((pVVar3->users).count == 1)) {
            value[1].users.data = (VmValue **)instruction;
            type_00 = (pVVar3->type).structType;
            if ((type_00 == (TypeBase *)0x0) || (type_00->typeID != 0x13)) {
              type_00 = (TypeBase *)0x0;
            }
            type = (TypeBase *)type_00[1]._vptr_TypeBase;
            src = anon_unknown.dwarf_20a43d::CreateAlloca
                            (ctx,module,(instruction->super_VmValue).source,type_00,"array_elem",
                             true);
            for (index = VM_TYPE_VOID; index < pVVar3[1].type.type; index = index + VM_TYPE_INT) {
              ppVVar4 = SmallArray<VmValue_*,_4U>::operator[]
                                  ((SmallArray<VmValue_*,_4U> *)&pVVar3[1].typeID,index);
              value_00 = *ppVVar4;
              if ((value_00 == (VmValue *)0x0) || (value_00->typeID != 2)) {
                in_stack_ffffffffffffff78 = (int)type->size * index;
                anon_unknown.dwarf_20a43d::CreateStore
                          (ctx,module,(instruction->super_VmValue).source,type,&src->super_VmValue,
                           value_00,in_stack_ffffffffffffff78);
              }
              else {
                value_01 = value_00;
                if (*(int *)&value_00[1]._vptr_VmValue == 0x11) {
                  ppVVar4 = SmallArray<VmValue_*,_4U>::operator[]
                                      ((SmallArray<VmValue_*,_4U> *)&value_00[1].typeID,0);
                  value_01 = *ppVVar4;
                }
                value[1].users.data = (VmValue **)value_00;
                in_stack_ffffffffffffff78 = (int)type->size * index;
                anon_unknown.dwarf_20a43d::CreateStore
                          (ctx,module,(instruction->super_VmValue).source,type,&src->super_VmValue,
                           value_01,in_stack_ffffffffffffff78);
                value[1].users.data = (VmValue **)instruction;
              }
            }
            anon_unknown.dwarf_20a43d::CreateMemCopy
                      (module,(instruction->super_VmValue).source,pVVar1,
                       *(uint *)&pVVar5[1]._vptr_VmValue,&src->super_VmValue,(uint)type_00->size,
                       in_stack_ffffffffffffff78);
            value[1].users.data = *(VmValue ***)&value[1].hasSideEffects;
            VmBlock::RemoveInstruction((VmBlock *)value,instruction);
          }
        }
      }
    }
    else {
      if (value->typeID != 4) {
        return;
      }
      ppVVar7 = (VmBlock **)&module->currentFunction;
      module->currentFunction = (VmFunction *)value;
      pIVar6 = (InplaceStr *)&value[1].source;
      while (pVVar1 = (VmValue *)pIVar6->begin, pVVar1 != (VmValue *)0x0) {
        RunArrayToElements(ctx,module,pVVar1);
        pIVar6 = &pVVar1[1].comment;
      }
    }
    *ppVVar7 = (VmBlock *)0x0;
  }
  return;
}

Assistant:

void RunArrayToElements(ExpressionContext &ctx, VmModule *module, VmValue* value)
{
	if(VmFunction *function = getType<VmFunction>(value))
	{
		module->currentFunction = function;

		for(VmBlock *curr = function->firstBlock; curr; curr = curr->nextSibling)
			RunArrayToElements(ctx, module, curr);

		module->currentFunction = NULL;
	}
	else if(VmBlock *block = getType<VmBlock>(value))
	{
		module->currentBlock = block;

		for(VmInstruction *curr = block->firstInstruction; curr;)
		{
			// If replacement succeeds, we will continue from the same place to handle multi-level arrays
			VmInstruction *next = curr->nextSibling;

			if(curr->cmd == VM_INST_STORE_STRUCT)
			{
				VmValue *storeAddress = curr->arguments[0];
				VmConstant *storeOffset = getType<VmConstant>(curr->arguments[1]);
				VmInstruction *storeValue = getType<VmInstruction>(curr->arguments[2]);

				if(storeValue)
				{
					if(storeValue->cmd == VM_INST_ARRAY && storeValue->users.size() == 1)
					{
						block->insertPoint = curr;

						TypeArray *typeArray = getType<TypeArray>(storeValue->type.structType);

						TypeBase *elementType = typeArray->subType;

						VmConstant *tempAddress = CreateAlloca(ctx, module, curr->source, typeArray, "array_elem", true);

						for(unsigned i = 0; i < storeValue->arguments.size(); i++)
						{
							VmValue *element = storeValue->arguments[i];

							if(VmInstruction *elementInst = getType<VmInstruction>(element))
							{
								if(elementInst->cmd == VM_INST_DOUBLE_TO_FLOAT)
									element = elementInst->arguments[0];

								block->insertPoint = elementInst;

								CreateStore(ctx, module, curr->source, elementType, tempAddress, element, unsigned(elementType->size * i));

								block->insertPoint = curr;
							}
							else
							{
								CreateStore(ctx, module, curr->source, elementType, tempAddress, element, unsigned(elementType->size * i));
							}
						}

						CreateMemCopy(module, curr->source, storeAddress, storeOffset->iValue, tempAddress, 0, int(typeArray->size));

						block->insertPoint = block->lastInstruction;

						block->RemoveInstruction(curr);
					}
				}
			}

			curr = next;
		}

		module->currentBlock = NULL;
	}
}